

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O3

void __thiscall MIDISong2::ProcessInitialMetaEvents(MIDISong2 *this)

{
  TrackInfo *pTVar1;
  byte *pbVar2;
  BYTE BVar3;
  TrackInfo *pTVar4;
  ulong uVar5;
  BYTE *pBVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  if (0 < this->NumTracks) {
    lVar12 = 0;
    do {
      pTVar4 = this->Tracks;
      pTVar1 = pTVar4 + lVar12;
      bVar8 = pTVar4[lVar12].Finished;
      uVar11 = pTVar4[lVar12].TrackP;
      bVar7 = bVar8;
joined_r0x0033afbc:
      if ((((bVar7 != 0) || (uVar5 = pTVar1->MaxTrackP, uVar5 - 4 <= uVar11)) ||
          (pBVar6 = pTVar1->TrackBegin, pBVar6[uVar11] != '\0')) || (pBVar6[uVar11 + 1] != 0xff))
      goto LAB_0033afbe;
      BVar3 = pBVar6[uVar11 + 2];
      pTVar1->TrackP = uVar11 + 3;
      uVar10 = 0;
      uVar11 = uVar11 + 3;
      do {
        uVar9 = uVar11;
        if (uVar5 <= uVar11) break;
        uVar9 = uVar11 + 1;
        pTVar1->TrackP = uVar9;
        pbVar2 = pBVar6 + uVar11;
        uVar10 = (ulong)((int)uVar10 << 7 | *pbVar2 & 0x7f);
        uVar11 = uVar9;
      } while ((char)*pbVar2 < '\0');
      uVar11 = uVar9 + uVar10;
      if (uVar5 < uVar11) {
LAB_0033b083:
        pTVar1->TrackP = uVar11;
        bVar7 = bVar8 & 1;
        goto joined_r0x0033afbc;
      }
      if (BVar3 == 'Q') {
        MIDIStreamer::SetTempo
                  (&this->super_MIDIStreamer,
                   (uint)pBVar6[uVar9 + 2] |
                   (uint)pBVar6[uVar9 + 1] << 8 | (uint)pBVar6[uVar9] << 0x10);
        bVar8 = pTVar1->Finished;
        uVar11 = uVar10 + pTVar1->TrackP;
        goto LAB_0033b083;
      }
      if (BVar3 != '/') goto LAB_0033b083;
      pTVar1->Finished = true;
      pTVar1->TrackP = uVar11;
LAB_0033afbe:
      if (pTVar1->MaxTrackP - 4 <= uVar11) {
        pTVar1->Finished = true;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->NumTracks);
  }
  return;
}

Assistant:

void MIDISong2::ProcessInitialMetaEvents ()
{
	TrackInfo *track;
	int i;
	BYTE event;
	DWORD len;

	for (i = 0; i < NumTracks; ++i)
	{
		track = &Tracks[i];
		while (!track->Finished &&
				track->TrackP < track->MaxTrackP - 4 &&
				track->TrackBegin[track->TrackP] == 0 &&
				track->TrackBegin[track->TrackP+1] == 0xFF)
		{
			event = track->TrackBegin[track->TrackP+2];
			track->TrackP += 3;
			len = track->ReadVarLen ();
			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					SetTempo(
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2])
					);
					break;
				}
			}
			track->TrackP += len;
		}
		if (track->TrackP >= track->MaxTrackP - 4)
		{
			track->Finished = true;
		}
	}
}